

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

void __thiscall
lest::passing::passing(passing *this,location *where_,text *expr_,text *decomposition_,bool zen)

{
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  text local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  text local_70;
  location local_50;
  
  std::__cxx11::string::string((string *)&local_70,"passed",&local_d1);
  location::location(&local_50,where_);
  if (zen) {
    std::__cxx11::string::string((string *)&local_d0,"",&local_d2);
  }
  else {
    std::operator+(&local_d0," for ",decomposition_);
  }
  std::operator+(&local_90,expr_,&local_d0);
  std::__cxx11::string::string((string *)&local_b0,"",&local_d3);
  success::success(&this->super_success,&local_70,&local_50,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  *(undefined ***)&(this->super_success).super_message = &PTR__message_0010fc70;
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}